

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O2

int chain_segment_mix_bypass(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_segment *segment_00;
  mixed_segment *segment_01;
  int iVar2;
  byte bVar3;
  uint location;
  uint uVar4;
  mixed_channel_t outc;
  mixed_channel_t inc;
  mixed_buffer *outb;
  mixed_buffer *inb;
  
  iVar2 = (int)*(long *)((long)segment->data + 8);
  if (iVar2 == 0) {
    uVar4 = 1;
  }
  else {
    puVar1 = *segment->data;
    segment_00 = (mixed_segment *)*puVar1;
    segment_01 = (mixed_segment *)puVar1[iVar2 - 1];
    iVar2 = mixed_segment_get(0x24,&inc,segment_00);
    uVar4 = 0;
    if ((iVar2 != 0) && (iVar2 = mixed_segment_get(0x25,&outc,segment_01), iVar2 != 0)) {
      uVar4 = 0;
      do {
        location = uVar4;
        bVar3 = outc;
        if (inc < outc) {
          bVar3 = inc;
        }
        if (bVar3 <= location) break;
        iVar2 = mixed_segment_get_in(0,location,&inb,segment_00);
        if ((iVar2 == 0) || (iVar2 = mixed_segment_get_out(0,location,&outb,segment_01), iVar2 == 0)
           ) {
          return 0;
        }
        iVar2 = mixed_buffer_transfer(inb,outb);
        uVar4 = location + 1;
      } while (iVar2 != 0);
      uVar4 = (uint)(bVar3 <= location);
    }
  }
  return uVar4;
}

Assistant:

int chain_segment_mix_bypass(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;

  if(count == 0) return 1;

  struct mixed_segment *in = data->data[0];
  struct mixed_segment *out = data->data[count-1];
  
  mixed_channel_t inc, outc;
  if(!mixed_segment_get(MIXED_IN_COUNT, &inc, in)) return 0;
  if(!mixed_segment_get(MIXED_OUT_COUNT, &outc, out)) return 0;
  
  for(mixed_channel_t c=0; c<MIN(inc,outc); ++c){
    struct mixed_buffer *inb, *outb;
    if(!mixed_segment_get_in(MIXED_BUFFER, c, &inb, in)) return 0;
    if(!mixed_segment_get_out(MIXED_BUFFER, c, &outb, out)) return 0;
    if(!mixed_buffer_transfer(inb, outb)) return 0;
  }
  return 1;
}